

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O0

mecab_node_t * __thiscall
MeCab::Tokenizer<mecab_node_t,_mecab_path_t>::getEOSNode
          (Tokenizer<mecab_node_t,_mecab_path_t> *this,
          Allocator<mecab_node_t,_mecab_path_t> *allocator)

{
  mecab_node_t *pmVar1;
  Allocator<mecab_node_t,_mecab_path_t> *in_RDI;
  mecab_node_t *eos_node;
  
  pmVar1 = getBOSNode((Tokenizer<mecab_node_t,_mecab_path_t> *)eos_node,in_RDI);
  pmVar1->stat = '\x03';
  return pmVar1;
}

Assistant:

N *Tokenizer<N, P>::getEOSNode(Allocator<N, P> *allocator) const {
  N *eos_node = getBOSNode(allocator);  // same
  eos_node->stat = MECAB_EOS_NODE;
  return eos_node;
}